

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_profiler.hpp
# Opt level: O3

void __thiscall fp::collector::collector(collector *this,string *name)

{
  int iVar1;
  pthread_t pVar2;
  timespec *ptVar3;
  ostream *poVar4;
  timespec ts;
  long *local_1b8 [2];
  long local_1a8 [2];
  timespec local_198;
  uint auStack_180 [22];
  ios_base local_128 [264];
  
  iVar1 = clock_gettime(3,&local_198);
  if (iVar1 != 0) {
    __assert_fail("0 && \"Boost::Chrono - Internal Error\"",
                  "/usr/include/boost/chrono/detail/inlined/posix/thread_clock.hpp",0x2a,
                  "static thread_clock::time_point boost::chrono::thread_clock::now()");
  }
  (this->m_thread_last).d_.rep_ = local_198.tv_sec * 1000000000 + local_198.tv_nsec;
  iVar1 = clock_gettime(1,&local_198);
  if (iVar1 == 0) {
    (this->m_steady_last).d_.rep_ = local_198.tv_sec * 1000000000 + local_198.tv_nsec;
    this->m_count = 0;
    (this->m_thread_accumulator).rep_ = 0;
    (this->m_steady_accumulator).rep_ = 0;
    iVar1 = clock_gettime(1,&local_198);
    if (iVar1 == 0) {
      (this->m_last_report).d_.rep_ = local_198.tv_sec * 1000000000 + local_198.tv_nsec;
      (this->m_fmt)._M_dataplus._M_p = (pointer)&(this->m_fmt).field_2;
      (this->m_fmt)._M_string_length = 0;
      (this->m_fmt).field_2._M_local_buf[0] = '\0';
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
      ptVar3 = &local_198;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)ptVar3,"[FP] ",5);
      *(uint *)((long)auStack_180 + *(long *)(local_198.tv_sec + -0x18)) =
           *(uint *)((long)auStack_180 + *(long *)(local_198.tv_sec + -0x18)) & 0xffffffb5 | 8;
      pVar2 = pthread_self();
      if (pVar2 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)ptVar3,"thread::id of a non-executing thread",0x24);
      }
      else {
        ptVar3 = (timespec *)std::ostream::_M_insert<unsigned_long>((ulong)&local_198);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)ptVar3," ",1);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)ptVar3,(name->_M_dataplus)._M_p,name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4," #%-7lu %8.5F %8.5F %11.4F %11.4F\n",0x22);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&this->m_fmt,(string *)local_1b8);
      if (local_1b8[0] != local_1a8) {
        operator_delete(local_1b8[0],local_1a8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
      std::ios_base::~ios_base(local_128);
      return;
    }
  }
  __assert_fail("0 && \"Boost::Chrono - Internal Error\"",
                "/usr/include/boost/chrono/detail/inlined/posix/chrono.hpp",0x58,
                "static steady_clock::time_point boost::chrono::steady_clock::now()");
}

Assistant:

collector(const std::string &name)
    : m_thread_last{thread_clock::now()},
      m_steady_last{steady_clock::now()},
      m_count{0},
      m_thread_accumulator{0},
      m_steady_accumulator{0},
      m_last_report{steady_clock::now()}
  {
    std::ostringstream os;
    os << "[FP] " << std::hex << std::this_thread::get_id() << " " << name << " #%-7lu %8.5F %8.5F %11.4F %11.4F\n";
    m_fmt = os.str();
  }